

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int base64_encode(void *in_buf,uint in_size,char *out_buf,uint out_size,BASE64_OPTIONS *options)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  BASE64_OPTIONS *pBVar9;
  char local_68 [32];
  char table [64];
  
  pBVar9 = &base64_def_options;
  if (options != (BASE64_OPTIONS *)0x0) {
    pBVar9 = options;
  }
  uVar8 = (int)((ulong)(in_size + 2) * 0xaaaaaaab >> 0x20) * 2 & 0xfffffffc;
  if (pBVar9->pad == '\0') {
    if (in_size % 3 == 2) {
      uVar8 = uVar8 - 1;
    }
    else if (in_size % 3 == 1) {
      uVar8 = uVar8 - 2;
    }
  }
  if (out_buf == (char *)0x0) {
    return uVar8 + 1;
  }
  if (out_size < uVar8) {
    return -0x69;
  }
  builtin_strncpy(table + 0x10,"wxyz0123456789",0xe);
  builtin_strncpy(table,"ghijklmnopqrstuv",0x10);
  builtin_strncpy(local_68 + 0x10,"QRSTUVWXYZabcdef",0x10);
  builtin_strncpy(local_68,"ABCDEFGHIJKLMNOP",0x10);
  table[0x1e] = pBVar9->ch62;
  table[0x1f] = pBVar9->ch63;
  uVar6 = 0;
  uVar8 = 0;
  if (2 < in_size) {
    uVar8 = 0;
    uVar5 = 0;
    do {
      bVar1 = *(byte *)((long)in_buf + (ulong)uVar5);
      uVar3 = (uint)*(byte *)((long)in_buf + (ulong)(uVar5 + 1)) * 0x100;
      bVar2 = *(byte *)((long)in_buf + (ulong)(uVar5 + 2));
      out_buf[uVar8] = local_68[bVar1 >> 2];
      out_buf[uVar8 + 1] = local_68[(uVar3 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
      uVar4 = uVar8 + 3;
      out_buf[uVar8 + 2] = local_68[uVar3 + bVar2 >> 6 & 0x3f];
      uVar8 = uVar8 + 4;
      out_buf[uVar4] = local_68[bVar2 & 0x3f];
      uVar6 = (ulong)(uVar5 + 3);
      uVar4 = uVar5 + 6;
      uVar5 = uVar5 + 3;
    } while (uVar4 <= in_size);
  }
  uVar5 = (int)uVar6 + 1;
  if (uVar5 == in_size) {
    bVar1 = *(byte *)((long)in_buf + uVar6);
    uVar6 = (ulong)uVar8;
    out_buf[uVar6] = local_68[bVar1 >> 2];
    out_buf[uVar6 + 1] = local_68[(bVar1 & 3) << 4];
    uVar6 = uVar6 | 2;
    if (pBVar9->pad == '\0') goto LAB_00104c10;
    out_buf[uVar6] = pBVar9->pad;
    cVar7 = pBVar9->pad;
LAB_00104c03:
    uVar5 = uVar8 | 3;
    uVar8 = uVar8 + 4;
    out_buf[uVar5] = cVar7;
  }
  else if ((int)uVar6 + 2U == in_size) {
    bVar1 = *(byte *)((long)in_buf + uVar6);
    uVar5 = (uint)*(byte *)((long)in_buf + (ulong)uVar5);
    out_buf[uVar8] = local_68[bVar1 >> 2];
    out_buf[(ulong)uVar8 + 1] = local_68[(uVar5 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
    uVar6 = (ulong)(uVar8 | 3);
    out_buf[(ulong)uVar8 + 2] = local_68[(ulong)(uVar5 & 0xf) * 4];
    cVar7 = pBVar9->pad;
    if (cVar7 == '\0') goto LAB_00104c10;
    goto LAB_00104c03;
  }
  uVar6 = (ulong)uVar8;
LAB_00104c10:
  uVar8 = (uint)uVar6;
  if (out_size <= uVar8) {
    return uVar8;
  }
  out_buf[uVar6] = '\0';
  return uVar8;
}

Assistant:

int
base64_encode(const void* in_buf, unsigned in_size,
              char* out_buf, unsigned out_size,
              const BASE64_OPTIONS* options)
{
    char table[64];
    const uint8_t* in = (const uint8_t*) in_buf;
    char* out = out_buf;
    unsigned out_size_needed;
    unsigned in_off = 0;
    unsigned out_off = 0;
    unsigned v;

    if(options == NULL)
        options = &base64_def_options;

    /* Every three bytes are encoded into 4 characters of output.
     * Finally add +1 for zero terminator. */
    out_size_needed = ((in_size + 2) / 3) * 4;

    /* With padding disabled, we may need little less. */
    if(!options->pad) {
        switch(in_size % 3) {
            case 0: break;
            case 1: out_size_needed -= 2; break;
            case 2: out_size_needed -= 1; break;
        }
    }

    if(out_buf == NULL) {
        /* Recommend caller +1 for zero terminator. */
        return out_size_needed + 1;
    }

    /* Check we have enough space in the output. */
    if(out_size < out_size_needed)
        return -ENOBUFS;

    /* Build table. */
    memcpy(table, base64_table_core, 62);
    table[62] = options->ch62;
    table[63] = options->ch63;

    /* Main loop. We process triples of input bytes at once to avoid branches
     * inside the loop and handle indivisible tail below specially. */
    while(in_off + 3 <= in_size) {
        v  = ((unsigned) in[in_off++]) << 16;
        v |= ((unsigned) in[in_off++]) <<  8;
        v |= ((unsigned) in[in_off++]);

        out[out_off++] = table[(uint8_t)(v >> 18) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >> 12) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >>  6) & 0x3f];
        out[out_off++] = table[(uint8_t)(v      ) & 0x3f];
    }

    /* Process a tail of one or two remaining input bytes.
     * Note one-byte tail corresponds to two characters in output,
     * and two-byte tail to three characters of output. */
    if(in_off + 1 == in_size) {                     /* One-byte tail. */
        v = ((unsigned) in[in_off++]) << 16;
        out[out_off++] = table[(uint8_t)(v >> 18) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >> 12) & 0x3f];

        /* Add two padding chars. */
        if(options->pad) {
            out[out_off++] = options->pad;
            out[out_off++] = options->pad;
        }
    } else if(in_off + 2 == in_size) {              /* Two-byte tail. */
        v = ((unsigned) in[in_off++]) << 16;
        v |= ((unsigned) in[in_off++]) << 8;
        out[out_off++] = table[(uint8_t)(v >> 18) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >> 12) & 0x3f];
        out[out_off++] = table[(uint8_t)(v >>  6) & 0x3f];

        /* Add one padding char. */
        if(options->pad)
            out[out_off++] = options->pad;
    }

    /* Add terminator. */
    if(out_off < out_size)
        out[out_off] = '\0';

    return out_off;
}